

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error asmjit::v1_14::BaseBuilder_newLabelInternal(BaseBuilder *self,uint32_t labelId)

{
  int iVar1;
  Error EVar2;
  LabelNode **ppLVar3;
  int in_ESI;
  long in_RDI;
  Error _err;
  LabelNode *node;
  Error err;
  uint32_t growBy;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  ZoneAllocator *in_stack_ffffffffffffffb8;
  LabelNode *pLVar4;
  uint in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  Error in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Error local_14;
  
  if (*(uint *)(in_RDI + 400) < in_ESI + 1U) {
    iVar1 = in_ESI - *(int *)(in_RDI + 400);
    EVar2 = ZoneVector<asmjit::v1_14::LabelNode_*>::willGrow
                      ((ZoneVector<asmjit::v1_14::LabelNode_*> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ZoneAllocator *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc4);
    if (EVar2 == 0) {
      local_14 = BaseBuilder::_newNodeT<asmjit::v1_14::LabelNode,unsigned_int&>
                           ((BaseBuilder *)CONCAT44(in_ESI,iVar1),
                            (LabelNode **)(ulong)in_stack_ffffffffffffffd0,
                            (uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (local_14 == 0) {
        ZoneVector<asmjit::v1_14::LabelNode_*>::resize
                  ((ZoneVector<asmjit::v1_14::LabelNode_*> *)(ulong)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8,0);
        pLVar4 = (LabelNode *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        ppLVar3 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[]
                            ((ZoneVector<asmjit::v1_14::LabelNode_*> *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             CONCAT44(local_14,in_stack_ffffffffffffffc0));
        *ppLVar3 = pLVar4;
        *(int *)(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) + 0x30) = in_ESI;
        local_14 = 0;
      }
    }
    else {
      local_14 = BaseEmitter::reportError
                           ((BaseEmitter *)CONCAT44(EVar2,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc,
                            (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    return local_14;
  }
  DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
}

Assistant:

static Error BaseBuilder_newLabelInternal(BaseBuilder* self, uint32_t labelId) {
  ASMJIT_ASSERT(self->_labelNodes.size() < labelId + 1);

  uint32_t growBy = labelId - self->_labelNodes.size();
  Error err = self->_labelNodes.willGrow(&self->_allocator, growBy);

  if (ASMJIT_UNLIKELY(err))
    return self->reportError(err);

  LabelNode* node;
  ASMJIT_PROPAGATE(self->_newNodeT<LabelNode>(&node, labelId));

  self->_labelNodes.resize(&self->_allocator, labelId + 1);
  self->_labelNodes[labelId] = node;
  node->_labelId = labelId;
  return kErrorOk;
}